

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

shared_ptr<chatra::Node> *
chatra::
addNode<std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
          (vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           *container,shared_ptr<chatra::Line> *line,NodeType type)

{
  NodeType NVar1;
  shared_ptr<chatra::Line> *psVar2;
  __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this;
  element_type *peVar3;
  value_type *node;
  shared_ptr<chatra::Node> local_30;
  NodeType local_19;
  shared_ptr<chatra::Line> *psStack_18;
  NodeType type_local;
  shared_ptr<chatra::Line> *line_local;
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  *container_local;
  
  local_19 = type;
  psStack_18 = line;
  line_local = (shared_ptr<chatra::Line> *)container;
  std::make_shared<chatra::Node>();
  std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
  emplace_back<std::shared_ptr<chatra::Node>>
            ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>> *)
             container,&local_30);
  std::shared_ptr<chatra::Node>::~shared_ptr(&local_30);
  this = (__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
         std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
         ::back((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 *)line_local);
  NVar1 = local_19;
  peVar3 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(this);
  psVar2 = psStack_18;
  peVar3->type = NVar1;
  peVar3 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(this);
  std::shared_ptr<chatra::Line>::operator=(&peVar3->line,psVar2);
  return (shared_ptr<chatra::Node> *)this;
}

Assistant:

static std::shared_ptr<Node>& addNode(NodePtrContainer& container, const std::shared_ptr<Line>& line, NodeType type) {
	container.emplace_back(std::make_shared<Node>());
	auto& node = container.back();

	node->type = type;
	node->line = line;
	return node;
}